

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::AddProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  BYTE BVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  DynamicType *type;
  PathTypeHandlerBase *pPVar7;
  SimpleDictionaryTypeHandler *this_00;
  PropertyRecord *ptr;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_02;
  undefined1 local_70 [16];
  Type local_60;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  PropertyIndex index;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  Type TStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local._7_1_ = attributes;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  library = (JavascriptLibrary *)
            RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  _indexVal = (RuntimeFunction *)ScriptContext::GetLibrary((ScriptContext *)library);
  BVar4 = GetDescriptor(this,value_local._4_4_,(PropertyIndex *)((long)&propertyRecord + 6));
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x451,"(!GetDescriptor(propertyId, &index))",
                                "!GetDescriptor(propertyId, &index)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar4 = ScriptContext::IsNumericPropertyId
                    ((ScriptContext *)library,value_local._4_4_,(uint32 *)&propertyRecord);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x452,
                                "(!scriptContext->IsNumericPropertyId(propertyId, &indexVal))",
                                "!scriptContext->IsNumericPropertyId(propertyId, &indexVal)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->propertyCount == 0) {
    ptr = ScriptContext::GetPropertyName((ScriptContext *)library,value_local._4_4_);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
              (&this->descriptors[this->propertyCount].Id,ptr);
    this->descriptors[this->propertyCount].field_1.Attributes = info_local._7_1_;
    if ((info_local._7_1_ & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
    }
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)(local_70 + 8));
    this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )(local_70 + 8));
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              (this_01,&this->super_DynamicTypeHandler,info_local._7_1_,value_local._4_4_,
               (ScriptContext *)library);
    JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_70);
    this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                         local_70);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<int>
              (this_02,&this->super_DynamicTypeHandler,info_local._7_1_,value_local._4_4_,
               (ScriptContext *)library);
    DynamicTypeHandler::SetSlotUnchecked
              ((DynamicObject *)TStack_20.ptr,this->propertyCount,TStack_30.ptr);
    PropertyValueInfo::Set
              ((PropertyValueInfo *)scriptContext,(RecyclableObject *)TStack_20.ptr,
               (PropertyIndex)this->propertyCount,info_local._7_1_,InlineCacheNoFlags);
    this->propertyCount = this->propertyCount + 1;
    BVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    if ((BVar3 != '\0') ||
       (BVar4 = Js::JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                          ((RecyclableObject *)TStack_20.ptr,value_local._4_4_), BVar4 != 0)) {
      ScriptContext::InvalidateProtoCaches((ScriptContext *)library,value_local._4_4_);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,value_local._4_4_,
               TStack_30.ptr,possibleSideEffects);
    return 1;
  }
  if (value_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x457,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  type = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
  bVar2 = DoConvertToPathType(type);
  if (!bVar2) {
    local_60.ptr = (RuntimeFunction *)
                   ScriptContext::GetPropertyName((ScriptContext *)library,value_local._4_4_);
    this_00 = ConvertToSimpleDictionaryType(this,(DynamicObject *)TStack_20.ptr);
    BVar4 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
            AddProperty<Js::PropertyRecord_const*>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                        *)this_00,(DynamicObject *)TStack_20.ptr,(PropertyRecord *)local_60.ptr,
                       TStack_30.ptr,info_local._7_1_,(PropertyValueInfo *)scriptContext,flags,
                       possibleSideEffects);
    return BVar4;
  }
  pPVar7 = ConvertToPathType(this,(DynamicObject *)TStack_20.ptr);
  iVar5 = (*(pPVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                    (pPVar7,TStack_20.ptr,(ulong)value_local._4_4_,TStack_30.ptr,
                     (ulong)info_local._7_1_,scriptContext,flags,0xf);
  return iVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
#if DBG
        PropertyIndex index;
        uint32 indexVal;
        Assert(!GetDescriptor(propertyId, &index));
        Assert(!scriptContext->IsNumericPropertyId(propertyId, &indexVal));
#endif

        if (propertyCount >= sizeof(descriptors)/sizeof(SimplePropertyDescriptor))
        {
            Assert(propertyId != Constants::NoProperty);
            if (DoConvertToPathType(instance->GetDynamicType()))
            {
                return ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags);
            }
            else
            {
                PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
                return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
            }
        }

        descriptors[propertyCount].Id = scriptContext->GetPropertyName(propertyId);
        descriptors[propertyCount].Attributes = attributes;
        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);

        SetSlotUnchecked(instance, propertyCount, value);
        PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(propertyCount), attributes);
        propertyCount++;

        if ((this->GetFlags() && IsPrototypeFlag)
            || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        return true;
    }